

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokFileDesc::add_source_line(CTcTokFileDesc *this,ulong linenum,ulong line_addr)

{
  size_t __size;
  CTcTokSrcPage **ppCVar1;
  CTcTokSrcPage *pCVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = linenum >> 10;
  uVar5 = (uint)linenum & 0x3ff;
  uVar3 = this->src_pages_alo_;
  if (uVar4 < uVar3) {
    ppCVar1 = this->src_pages_;
  }
  else {
    __size = uVar4 * 8 + 0x80;
    if (this->src_pages_ == (CTcTokSrcPage **)0x0) {
      ppCVar1 = (CTcTokSrcPage **)malloc(__size);
    }
    else {
      ppCVar1 = (CTcTokSrcPage **)realloc(this->src_pages_,__size);
      uVar3 = this->src_pages_alo_;
    }
    this->src_pages_ = ppCVar1;
    memset(ppCVar1 + uVar3,0,((uVar4 + 0x10) - uVar3) * 8);
    this->src_pages_alo_ = uVar4 + 0x10;
  }
  pCVar2 = ppCVar1[uVar4];
  if (pCVar2 == (CTcTokSrcPage *)0x0) {
    pCVar2 = (CTcTokSrcPage *)malloc(0x2000);
    ppCVar1[uVar4] = pCVar2;
    memset(this->src_pages_[uVar4],0,0x2000);
    pCVar2 = this->src_pages_[uVar4];
  }
  if (pCVar2->ofs[uVar5] == 0) {
    pCVar2->ofs[uVar5] = line_addr;
  }
  return;
}

Assistant:

void CTcTokFileDesc::add_source_line(ulong linenum, ulong line_addr)
{
    size_t page_idx;
    size_t idx;

    /* get the index of the page containing this source line */
    page_idx = linenum / TCTOK_SRC_PAGE_CNT;

    /* get the index of the entry within the page */
    idx = linenum % TCTOK_SRC_PAGE_CNT;

    /* 
     *   determine if our page index table is large enough, and expand it
     *   if not 
     */
    if (page_idx >= src_pages_alo_)
    {
        size_t siz;
        size_t new_alo;
        
        /* allocate or expand the source pages array */
        new_alo = page_idx + 16;
        siz = new_alo * sizeof(src_pages_[0]);
        if (src_pages_ == 0)
            src_pages_ = (CTcTokSrcPage **)t3malloc(siz);
        else
            src_pages_ = (CTcTokSrcPage **)t3realloc(src_pages_, siz);

        /* clear the new part */
        memset(src_pages_ + src_pages_alo_, 0,
               (new_alo - src_pages_alo_) * sizeof(src_pages_[0]));

        /* remember the new allocation size */
        src_pages_alo_ = new_alo;
    }

    /* if this page isn't allocated, do so now */
    if (src_pages_[page_idx] == 0)
    {
        /* allocate the new page */
        src_pages_[page_idx] = (CTcTokSrcPage *)
                               t3malloc(sizeof(CTcTokSrcPage));

        /* clear it */
        memset(src_pages_[page_idx], 0, sizeof(CTcTokSrcPage));
    }

    /* 
     *   if this source line entry has been previously set, don't change
     *   it; otherwise, store the new setting 
     */
    if (src_pages_[page_idx]->ofs[idx] == 0)
        src_pages_[page_idx]->ofs[idx] = line_addr;
}